

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O3

bool bssl::resolve_ecdhe_secret(SSL_HANDSHAKE *hs,SSL_CLIENT_HELLO *client_hello)

{
  uint16_t group_id;
  SSL *ssl;
  SSL_HANDSHAKE_HINTS *pSVar1;
  size_t sVar2;
  uchar *__src;
  byte bVar3;
  bool bVar4;
  int iVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  byte bVar6;
  uint desc;
  ulong uVar8;
  ptrdiff_t _Num;
  ptrdiff_t _Num_1;
  Span<const_unsigned_char> in;
  uint8_t alert;
  bool found_key_share;
  UniquePtr<SSLKeyShare> key_share;
  Array<unsigned_char> secret;
  Span<const_unsigned_char> peer_key;
  ScopedCBB ciphertext;
  byte local_9a;
  bool local_99;
  SSL_HANDSHAKE *local_98;
  _Head_base<0UL,_bssl::SSLKeyShare_*,_false> local_90;
  Array<unsigned_char> local_88;
  Span<const_unsigned_char> local_78;
  CBB local_60;
  byte *pbVar7;
  
  ssl = hs->ssl;
  group_id = ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->group_id;
  local_78.data_ = (uchar *)0x0;
  local_78.size_ = 0;
  local_9a = 0x32;
  bVar4 = ssl_ext_key_share_parse_clienthello(hs,&local_99,&local_78,&local_9a,client_hello);
  if (!bVar4) {
    ssl_send_alert(ssl,2,(uint)local_9a);
    return false;
  }
  if (local_99 == false) {
    ssl_send_alert(ssl,2,0x2f);
    ERR_put_error(0x10,0,0xf3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                  ,0x56);
    return false;
  }
  local_88.data_ = (uchar *)0x0;
  local_88.size_ = 0;
  pSVar1 = (hs->hints)._M_t.
           super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
  if ((((pSVar1 == (SSL_HANDSHAKE_HINTS *)0x0) || ((hs->field_0x6ca & 0x10) != 0)) ||
      (pSVar1->key_share_group_id != group_id)) || ((pSVar1->key_share_secret).size_ == 0)) {
    CBB_zero(&local_60);
    SSLKeyShare::Create((SSLKeyShare *)&local_90,group_id);
    if ((local_90._M_head_impl == (SSLKeyShare *)0x0) ||
       (iVar5 = CBB_init(&local_60,0x20), iVar5 == 0)) {
LAB_0026ed8b:
      desc = (uint)local_9a;
    }
    else {
      pbVar7 = &local_9a;
      iVar5 = (*(local_90._M_head_impl)->_vptr_SSLKeyShare[4])
                        (local_90._M_head_impl,&local_60,&local_88,pbVar7,local_78.data_,
                         local_78.size_);
      if (((char)iVar5 == '\0') ||
         (bVar4 = CBBFinishArray(&local_60,&hs->key_share_ciphertext), !bVar4)) goto LAB_0026ed8b;
      if ((pSVar1 == (SSL_HANDSHAKE_HINTS *)0x0) || ((hs->field_0x6ca & 0x10) == 0)) {
LAB_0026ed61:
        std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)&local_90);
        CBB_cleanup(&local_60);
        goto LAB_0026ed75;
      }
      pSVar1->key_share_group_id = group_id;
      local_98 = (SSL_HANDSHAKE *)(hs->key_share_ciphertext).data_;
      sVar2 = (hs->key_share_ciphertext).size_;
      bVar4 = Array<unsigned_char>::InitUninitialized(&pSVar1->key_share_ciphertext,sVar2);
      if (bVar4 && sVar2 != 0) {
        memmove((pSVar1->key_share_ciphertext).data_,local_98,sVar2);
      }
      sVar2 = local_88.size_;
      desc = 0x50;
      if (bVar4) {
        local_98 = (SSL_HANDSHAKE *)local_88.data_;
        bVar4 = Array<unsigned_char>::InitUninitialized(&pSVar1->key_share_secret,local_88.size_);
        uVar8 = CONCAT71(extraout_var_00,bVar4) & 0xffffffff;
        bVar3 = (byte)uVar8;
        bVar6 = bVar3 ^ 1 | (uchar *)sVar2 == (uchar *)0x0;
        pbVar7 = (byte *)CONCAT71((int7)(uVar8 >> 8),bVar6);
        if (bVar6 == 0) {
          memmove((pSVar1->key_share_secret).data_,local_98,sVar2);
        }
        if (bVar3 != 0) goto LAB_0026ed61;
      }
    }
    ssl_send_alert(ssl,2,desc);
    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)&local_90);
    CBB_cleanup(&local_60);
  }
  else {
    local_98 = (SSL_HANDSHAKE *)(pSVar1->key_share_ciphertext).data_;
    sVar2 = (pSVar1->key_share_ciphertext).size_;
    bVar4 = Array<unsigned_char>::InitUninitialized(&hs->key_share_ciphertext,sVar2);
    if (bVar4 && sVar2 != 0) {
      memmove((hs->key_share_ciphertext).data_,local_98,sVar2);
    }
    if (bVar4) {
      __src = (pSVar1->key_share_secret).data_;
      sVar2 = (pSVar1->key_share_secret).size_;
      bVar4 = Array<unsigned_char>::InitUninitialized(&local_88,sVar2);
      uVar8 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
      bVar3 = (byte)uVar8;
      bVar6 = bVar3 ^ 1 | sVar2 == 0;
      pbVar7 = (byte *)CONCAT71((int7)(uVar8 >> 8),bVar6);
      if (bVar6 == 0) {
        memmove(local_88.data_,__src,sVar2);
      }
      if (bVar3 != 0) {
LAB_0026ed75:
        in.size_ = (size_t)pbVar7;
        in.data_ = (uchar *)local_88.size_;
        bVar4 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)local_88.data_,in);
        goto LAB_0026edb5;
      }
    }
    ssl_send_alert(ssl,2,0x50);
  }
  bVar4 = false;
LAB_0026edb5:
  OPENSSL_free(local_88.data_);
  return bVar4;
}

Assistant:

static bool resolve_ecdhe_secret(SSL_HANDSHAKE *hs,
                                 const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  const uint16_t group_id = hs->new_session->group_id;

  bool found_key_share;
  Span<const uint8_t> peer_key;
  uint8_t alert = SSL_AD_DECODE_ERROR;
  if (!ssl_ext_key_share_parse_clienthello(hs, &found_key_share, &peer_key,
                                           &alert, client_hello)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!found_key_share) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_CURVE);
    return false;
  }

  Array<uint8_t> secret;
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (hints && !hs->hints_requested && hints->key_share_group_id == group_id &&
      !hints->key_share_secret.empty()) {
    // Copy the key_share secret from hints.
    if (!hs->key_share_ciphertext.CopyFrom(hints->key_share_ciphertext) ||
        !secret.CopyFrom(hints->key_share_secret)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return false;
    }
  } else {
    ScopedCBB ciphertext;
    UniquePtr<SSLKeyShare> key_share = SSLKeyShare::Create(group_id);
    if (!key_share ||  //
        !CBB_init(ciphertext.get(), 32) ||
        !key_share->Encap(ciphertext.get(), &secret, &alert, peer_key) ||
        !CBBFinishArray(ciphertext.get(), &hs->key_share_ciphertext)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
      return false;
    }
    if (hints && hs->hints_requested) {
      hints->key_share_group_id = group_id;
      if (!hints->key_share_ciphertext.CopyFrom(hs->key_share_ciphertext) ||
          !hints->key_share_secret.CopyFrom(secret)) {
        ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
        return false;
      }
    }
  }

  return tls13_advance_key_schedule(hs, secret);
}